

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode ws_setup_conn(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  (data->state).http_neg.field_0x3 = (data->state).http_neg.field_0x3 & 0xfb;
  (data->state).http_neg.field_0x3 = (data->state).http_neg.field_0x3 & 0xf7;
  (data->state).http_neg.wanted = '\x01';
  (data->state).http_neg.allowed = '\x01';
  CVar1 = Curl_http_setup_conn(data,conn);
  return CVar1;
}

Assistant:

static CURLcode ws_setup_conn(struct Curl_easy *data,
                              struct connectdata *conn)
{
  /* WebSockets is 1.1 only (for now) */
  data->state.http_neg.accept_09 = FALSE;
  data->state.http_neg.only_10 = FALSE;
  data->state.http_neg.wanted = CURL_HTTP_V1x;
  data->state.http_neg.allowed = CURL_HTTP_V1x;
  return Curl_http_setup_conn(data, conn);
}